

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O0

bool VerifyXrParent(XrObjectType handle1_type,uint64_t handle1,XrObjectType handle2_type,
                   uint64_t handle2,bool check_this)

{
  bool bVar1;
  uint64_t local_68;
  uint64_t parent2_handle;
  uint64_t uStack_58;
  XrObjectType parent2_type;
  uint64_t parent1_handle;
  uint64_t uStack_48;
  XrObjectType parent1_type;
  uint64_t parent_handle_1;
  uint64_t uStack_38;
  XrObjectType parent_type_1;
  uint64_t parent_handle;
  XrObjectType parent_type;
  bool check_this_local;
  uint64_t handle2_local;
  uint64_t uStack_18;
  XrObjectType handle2_type_local;
  uint64_t handle1_local;
  XrObjectType handle1_type_local;
  
  parent_handle._7_1_ = check_this;
  _parent_type = handle2;
  handle2_local._4_4_ = handle2_type;
  uStack_18 = handle1;
  handle1_local._0_4_ = handle1_type;
  bVar1 = IsIntegerNullHandle(handle1);
  if ((bVar1) || (bVar1 = IsIntegerNullHandle(_parent_type), bVar1)) {
    return false;
  }
  if (((parent_handle._7_1_ & 1) != 0) && ((XrObjectType)handle1_local == handle2_local._4_4_)) {
    return uStack_18 == _parent_type;
  }
  if (((XrObjectType)handle1_local == XR_OBJECT_TYPE_INSTANCE) &&
     (handle2_local._4_4_ != XR_OBJECT_TYPE_INSTANCE)) {
    bVar1 = GetXrParent(handle2_local._4_4_,_parent_type,(XrObjectType *)&parent_handle,
                        &stack0xffffffffffffffc8);
    if (!bVar1) {
      return false;
    }
    bVar1 = VerifyXrParent((XrObjectType)handle1_local,uStack_18,(XrObjectType)parent_handle,
                           uStack_38,true);
    return bVar1;
  }
  if ((handle2_local._4_4_ == XR_OBJECT_TYPE_INSTANCE) &&
     ((XrObjectType)handle1_local != XR_OBJECT_TYPE_INSTANCE)) {
    bVar1 = GetXrParent((XrObjectType)handle1_local,uStack_18,
                        (XrObjectType *)((long)&parent_handle_1 + 4),&stack0xffffffffffffffb8);
    if (!bVar1) {
      return false;
    }
    bVar1 = VerifyXrParent(parent_handle_1._4_4_,uStack_48,handle2_local._4_4_,_parent_type,true);
    return bVar1;
  }
  bVar1 = GetXrParent((XrObjectType)handle1_local,uStack_18,
                      (XrObjectType *)((long)&parent1_handle + 4),&stack0xffffffffffffffa8);
  if (!bVar1) {
    return false;
  }
  bVar1 = GetXrParent(handle2_local._4_4_,_parent_type,(XrObjectType *)((long)&parent2_handle + 4),
                      &local_68);
  if (!bVar1) {
    return false;
  }
  if (parent1_handle._4_4_ == handle2_local._4_4_) {
    return uStack_58 == _parent_type;
  }
  if ((XrObjectType)handle1_local == parent2_handle._4_4_) {
    return uStack_18 == local_68;
  }
  bVar1 = VerifyXrParent(parent1_handle._4_4_,uStack_58,parent2_handle._4_4_,local_68,true);
  return bVar1;
}

Assistant:

bool VerifyXrParent(XrObjectType handle1_type, const uint64_t handle1,
                    XrObjectType handle2_type, const uint64_t handle2,
                    bool check_this) {
    if (IsIntegerNullHandle(handle1) || IsIntegerNullHandle(handle2)) {
        return false;
    } else if (check_this && handle1_type == handle2_type) {
        return (handle1 == handle2);
    }
    if (handle1_type == XR_OBJECT_TYPE_INSTANCE && handle2_type != XR_OBJECT_TYPE_INSTANCE) {
        XrObjectType parent_type;
        uint64_t parent_handle;
        if (!GetXrParent(handle2_type, handle2, parent_type, parent_handle)) {
            return false;
        }
        return VerifyXrParent(handle1_type, handle1, parent_type, parent_handle, true);
    } else if (handle2_type == XR_OBJECT_TYPE_INSTANCE && handle1_type != XR_OBJECT_TYPE_INSTANCE) {
        XrObjectType parent_type;
        uint64_t parent_handle;
        if (!GetXrParent(handle1_type, handle1, parent_type, parent_handle)) {
            return false;
        }
        return VerifyXrParent(parent_type, parent_handle, handle2_type, handle2, true);
    } else {
        XrObjectType parent1_type;
        uint64_t parent1_handle;
                XrObjectType parent2_type;
        uint64_t parent2_handle;
        if (!GetXrParent(handle1_type, handle1, parent1_type, parent1_handle)) {
            return false;
        }
        if (!GetXrParent(handle2_type, handle2, parent2_type, parent2_handle)) {
            return false;
        }
        if (parent1_type == handle2_type) {
            return (parent1_handle == handle2);
        } else if (handle1_type == parent2_type) {
            return (handle1 == parent2_handle);
        } else {
            return VerifyXrParent(parent1_type, parent1_handle, parent2_type, parent2_handle, true);
        }
    }
    return false;
}